

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O2

target_ulong helper_dextp_mips64el(target_ulong ac,target_ulong size,CPUMIPSState_conflict5 *env)

{
  byte bVar1;
  sbyte sVar2;
  target_ulong tVar3;
  uint uVar4;
  uint uVar5;
  
  uVar4 = (uint)size & 0x3f;
  uVar5 = (uint)(env->active_tc).DSPControl;
  sVar2 = (sbyte)uVar4;
  if ((uVar5 & 0x7f) < uVar4) {
    uVar5 = uVar5 | 0x4000;
    tVar3 = 0;
  }
  else {
    bVar1 = (char)(uVar5 & 0x7f) - sVar2 & 0x3f;
    tVar3 = (2L << sVar2) - 1U &
            ((env->active_tc).LO[ac] >> bVar1 | (env->active_tc).HI[ac] << 0x40 - bVar1);
    uVar5 = uVar5 & 0xffffbfff;
  }
  (env->active_tc).DSPControl = (ulong)uVar5;
  return tVar3;
}

Assistant:

target_ulong helper_dextp(target_ulong ac, target_ulong size, CPUMIPSState *env)
{
    int start_pos;
    int len;
    int sub;
    uint64_t tempB, tempA;
    uint64_t temp;

    temp = 0;

    size = size & 0x3F;
    start_pos = get_DSPControl_pos(env);
    len = start_pos - size;
    tempB = env->active_tc.HI[ac];
    tempA = env->active_tc.LO[ac];

    sub = start_pos - (size + 1);

    if (sub >= -1) {
        temp = (tempB << (64 - len)) | (tempA >> len);
        temp = temp & ((1ULL << (size + 1)) - 1);
        set_DSPControl_efi(0, env);
    } else {
        set_DSPControl_efi(1, env);
    }

    return temp;
}